

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

void __thiscall
TPZBlockDiagonal<float>::TPZBlockDiagonal
          (TPZBlockDiagonal<float> *this,void **vtt,TPZVec<int> *blocksize)

{
  long local_28;
  
  *(undefined8 *)((long)&(this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow + 2) = 0;
  *(undefined8 *)((long)&(this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol + 2) = 0;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[3];
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[2];
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[1];
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)*vtt;
  (this->fStorage)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_016490a8;
  (this->fStorage).fStore = (float *)0x0;
  (this->fStorage).fNElements = 0;
  (this->fStorage).fNAlloc = 0;
  local_28 = 0;
  TPZVec<long>::TPZVec(&this->fBlockPos,1,&local_28);
  (this->fBlockSize)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fBlockSize).fStore = (int *)0x0;
  (this->fBlockSize).fNElements = 0;
  (this->fBlockSize).fNAlloc = 0;
  Initialize(this,blocksize);
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal(const TPZVec<int> &blocksize)
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>(), fStorage(), fBlockPos(1,0),fBlockSize()
{
	Initialize(blocksize);
}